

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclWorker.cpp
# Opt level: O2

void __thiscall xmrig::OclWorker::start(OclWorker *this)

{
  bool bVar1;
  uint64_t t;
  cl_uint results [256];
  duration<long,_std::ratio<1L,_1000L>_> local_440;
  uint32_t local_438 [255];
  uint local_3c;
  
  do {
    if (DAT_001bde58 == 0) {
      return;
    }
    if (((Nonce::m_paused & 1) != 0) || ((ready & 1) == 0)) {
      OclSharedData::setResumeCounter(this->m_sharedData,0);
      do {
        local_440.__r = 200;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_440);
        if (((Nonce::m_paused & 1) == 0) && ((ready & 1) != 0)) break;
      } while (DAT_001bde58 != 0);
      if (DAT_001bde58 == 0) {
        return;
      }
      OclSharedData::resumeDelay(this->m_sharedData,(this->super_Worker).m_id);
      bVar1 = consumeJob(this);
      if (!bVar1) {
        return;
      }
    }
    while (DAT_001bde58 == (this->m_job).m_sequence) {
      OclSharedData::adjustDelay(this->m_sharedData,(this->super_Worker).m_id);
      t = Chrono::steadyMSecs();
      (*this->m_runner->_vptr_IOclRunner[0xc])
                (this->m_runner,
                 (ulong)*(uint *)((this->m_job).m_blobs[(this->m_job).m_index] + 0x27),local_438);
      if ((ulong)local_3c != 0) {
        JobResults::submit((Job *)&(this->m_job).m_jobs[(this->m_job).m_index].m_seed,local_438,
                           (ulong)local_3c);
      }
      WorkerJob<1UL>::nextRound
                (&this->m_job,(int)(0x8000 / (ulong)this->m_intensity) + 1,this->m_intensity);
      storeStats(this,t);
      sched_yield();
    }
    bVar1 = consumeJob(this);
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void xmrig::OclWorker::start()
{
    cl_uint results[0x100];

    while (Nonce::sequence(Nonce::OPENCL) > 0) {
        if (!isReady()) {
            m_sharedData.setResumeCounter(0);

            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (!isReady() && Nonce::sequence(Nonce::OPENCL) > 0);

            if (Nonce::sequence(Nonce::OPENCL) == 0) {
                break;
            }

            m_sharedData.resumeDelay(m_id);

            if (!consumeJob()) {
                return;
            }
        }

        while (!Nonce::isOutdated(Nonce::OPENCL, m_job.sequence())) {
            m_sharedData.adjustDelay(m_id);

            const uint64_t t = Chrono::steadyMSecs();

            try {
                m_runner->run(*m_job.nonce(), results);
            }
            catch (std::exception &ex) {
                printError(id(), ex.what());

                return;
            }

            if (results[0xFF] > 0) {
                JobResults::submit(m_job.currentJob(), results, results[0xFF]);
            }

            m_job.nextRound(roundSize(m_intensity), m_intensity);

            storeStats(t);
            std::this_thread::yield();
        }

        if (!consumeJob()) {
            return;
        }
    }
}